

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  undefined4 in_register_00000034;
  Type local_40;
  long local_28;
  AsyncIoStreamWithGuards *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (AsyncIoStreamWithGuards *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  if ((*(byte *)(local_28 + 0x49) & 1) == 0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_40);
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
              ((Promise<void> *)this,&local_40);
    Promise<void>::~Promise((Promise<void> *)&local_40);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(local_28 + 0x18));
    local_40.pieces.ptr = (ArrayPtr<const_unsigned_char> *)this_local;
    local_40.pieces.size_ = (size_t)pieces_local.ptr;
    (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
              (this,&pAVar1->super_AsyncOutputStream,this_local,pieces_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (writeGuardReleased) {
      return inner->write(pieces);
    } else {
      return writeGuard.addBranch().then([this, pieces]() {
        return inner->write(pieces);
      });
    }
  }